

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O1

OPJ_BOOL bmp_read_raw_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                          OPJ_UINT32 height)

{
  size_t sVar1;
  ulong __n;
  
  __n = (ulong)(stride * width);
  sVar1 = fread(pData,1,__n,(FILE *)IN);
  if (sVar1 != __n) {
    bmp_read_raw_data_cold_1();
  }
  return (uint)(sVar1 == __n);
}

Assistant:

static OPJ_BOOL bmp_read_raw_data(FILE* IN, OPJ_UINT8* pData, OPJ_UINT32 stride,
                                  OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_ARG_NOT_USED(width);

    if (fread(pData, sizeof(OPJ_UINT8), stride * height, IN) != (stride * height)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return OPJ_FALSE;
    }
    return OPJ_TRUE;
}